

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O3

MDD lddmc_follow(MDD mdd,uint32_t value)

{
  uint8_t *puVar1;
  long lVar2;
  
  if (1 < mdd) {
    puVar1 = nodes->data;
    do {
      lVar2 = mdd * 0x10;
      if (((uint)*(ulong *)(puVar1 + lVar2 + 8) >> 0x10 & 1) == 0) {
        if (*(uint *)(puVar1 + lVar2 + 6) == value) {
          return *(ulong *)(puVar1 + lVar2 + 8) >> 0x11;
        }
        if (value < *(uint *)(puVar1 + lVar2 + 6)) {
          return 0;
        }
      }
      mdd = *(ulong *)(puVar1 + lVar2) >> 1 & 0x7fffffffffff;
    } while (1 < mdd);
  }
  return mdd;
}

Assistant:

MDD
lddmc_follow(MDD mdd, uint32_t value)
{
    for (;;) {
        if (mdd <= lddmc_true) return mdd;
        const mddnode_t n = LDD_GETNODE(mdd);
        if (!mddnode_getcopy(n)) {
            const uint32_t v = mddnode_getvalue(n);
            if (v == value) return mddnode_getdown(n);
            if (v > value) return lddmc_false;
        }
        mdd = mddnode_getright(n);
    }
}